

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall mathOps_trigTan_Test::~mathOps_trigTan_Test(mathOps_trigTan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(mathOps, trigTan)
{
    measurement m1(constants::pi / 6.0, rad);
    EXPECT_FLOAT_EQ(tan(m1), tan(constants::pi / 6.0));

    measurement m2(30.0, deg);
    EXPECT_FLOAT_EQ(tan(m2), tan(constants::pi / 6.0));

    precise_measurement m3(constants::pi / 6.0, precise::rad);
    EXPECT_DOUBLE_EQ(tan(m3), tan(constants::pi / 6.0));

    precise_measurement m4(30.0, precise::deg);
    EXPECT_DOUBLE_EQ(tan(m4), tan(constants::pi / 6.0));
}